

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinputdevice.h
# Opt level: O3

void __thiscall
UinputDevice::UinputDevice
          (UinputDevice *this,string *path,uint bus,string *name,uint vendor,uint product,
          uint version,
          vector<UinputDevice::PossibleEvent,_std::allocator<UinputDevice::PossibleEvent>_>
          *possibleEvents,
          vector<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>
          *absoluteAxesCalibrationData)

{
  uint uVar1;
  pointer pAVar2;
  pointer pPVar3;
  uint *puVar4;
  int iVar5;
  AbsoluteAxisCalibrationData *aacd;
  pointer pAVar6;
  ssize_t sVar7;
  ostream *poVar8;
  vector<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>
  *__range2;
  uint *puVar9;
  PossibleEvent *pe;
  pointer pPVar10;
  char local_48c [80];
  undefined2 local_43c;
  undefined2 local_43a;
  undefined2 local_438;
  undefined2 local_436;
  undefined1 local_434 [4];
  int aiStack_430 [64];
  int aiStack_330 [64];
  int aiStack_230 [64];
  int aiStack_130 [64];
  
  this->_fd = 0;
  destroy(this);
  iVar5 = ::open((path->_M_dataplus)._M_p,0x801);
  this->_fd = iVar5;
  if (iVar5 != 0) {
    memset(local_434,0,0x404);
    strncpy(local_48c,(name->_M_dataplus)._M_p,0x50);
    local_43c = (undefined2)bus;
    local_438 = (undefined2)product;
    local_43a = (undefined2)vendor;
    local_436 = (undefined2)version;
    pAVar2 = (absoluteAxesCalibrationData->
             super__Vector_base<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pAVar6 = (absoluteAxesCalibrationData->
                  super__Vector_base<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>
                  )._M_impl.super__Vector_impl_data._M_start; pAVar6 != pAVar2; pAVar6 = pAVar6 + 1)
    {
      aiStack_330[pAVar6->axis] = pAVar6->min;
      aiStack_430[pAVar6->axis] = pAVar6->max;
      aiStack_230[pAVar6->axis] = pAVar6->fuzz;
      aiStack_130[pAVar6->axis] = pAVar6->flat;
    }
    sVar7 = write(iVar5,local_48c,0x45c);
    if (sVar7 == 0x45c) {
      pPVar3 = (possibleEvents->
               super__Vector_base<UinputDevice::PossibleEvent,_std::allocator<UinputDevice::PossibleEvent>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pPVar10 = (possibleEvents->
                     super__Vector_base<UinputDevice::PossibleEvent,_std::allocator<UinputDevice::PossibleEvent>_>
                     )._M_impl.super__Vector_impl_data._M_start; pPVar10 != pPVar3;
          pPVar10 = pPVar10 + 1) {
        iVar5 = ioctl(this->_fd,0x40045564,(ulong)pPVar10->type);
        if (iVar5 < 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"ERROR: ioctl error adding event type ",0x25);
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
        }
        puVar4 = (pPVar10->codes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (puVar9 = (pPVar10->codes).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start; puVar9 != puVar4; puVar9 = puVar9 + 1) {
          if (pPVar10->type - 1 < 3) {
            uVar1 = *puVar9;
            iVar5 = ioctl(this->_fd,(ulong)pPVar10->type | 0x40045564,(ulong)uVar1);
            if (iVar5 < 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"ERROR: ioctl error adding event code ",0x25);
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar1);
              goto LAB_00102657;
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"ERROR: Unsupported event type ",0x1e);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
LAB_00102657:
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
          }
        }
      }
      iVar5 = ioctl(this->_fd,0x5501);
      if (iVar5 < 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"ERROR: ioctl error creating device",0x22);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
        std::ostream::put('\b');
        std::ostream::flush();
      }
    }
    else {
      close(this->_fd);
      this->_fd = 0;
    }
  }
  return;
}

Assistant:

UinputDevice::UinputDevice(std::string const& path, unsigned int bus, std::string const& name, unsigned int vendor, unsigned int product, unsigned int version, std::vector<PossibleEvent> const& possibleEvents, std::vector<AbsoluteAxisCalibrationData> const& absoluteAxesCalibrationData)
{
  _fd = 0;
  open(path);
  if(_fd)
  {
    uinput_user_dev device;
    memset(&device,0,sizeof(device));
    strncpy(device.name, name.data(), UINPUT_MAX_NAME_SIZE);
    device.id.bustype = bus;
    device.id.product = product;
    device.id.vendor = vendor;
    device.id.version = version;

    for(AbsoluteAxisCalibrationData const& aacd : absoluteAxesCalibrationData) {
      device.absmin[aacd.axis] = aacd.min;
      device.absmax[aacd.axis] = aacd.max;
      device.absfuzz[aacd.axis] = aacd.fuzz;
      device.absflat[aacd.axis] = aacd.flat;
    }

    if(write(_fd, &device, sizeof(device)) != sizeof(device))
    {
      close(_fd);
      _fd = 0;
    }
    else
    {
      for(PossibleEvent const& pe : possibleEvents)
      {
        if(ioctl(_fd, UI_SET_EVBIT, pe.type) < 0)
        {
          std::cerr << "ERROR: ioctl error adding event type " << pe.type << std::endl;
        }

        for(int code : pe.codes)
        {
          unsigned int type = 0;
          switch(pe.type)
          {
            case EV_KEY: type = UI_SET_KEYBIT; break;
            case EV_REL: type = UI_SET_RELBIT; break;
            case EV_ABS: type = UI_SET_ABSBIT; break;
            default: std:: cerr << "ERROR: Unsupported event type " << pe.type << std::endl;
          }

          if(type && ioctl(_fd, type, code) < 0)
          {
            std::cerr << "ERROR: ioctl error adding event code " << pe.type << " " << code << std::endl;
          }
        }
      }

      if(ioctl(_fd, UI_DEV_CREATE) < 0)
      {
        std::cerr << "ERROR: ioctl error creating device" << std::endl;
      }
    }
  }
}